

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_bzip2(archive *a,la_zstream *lastrm,int level)

{
  int iVar1;
  bz_stream *strm_00;
  bz_stream *strm;
  int level_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  strm_00 = (bz_stream *)calloc(1,0x50);
  if (strm_00 == (bz_stream *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for bzip2 stream");
    a_local._4_4_ = -0x1e;
  }
  else {
    strm_00->next_in = (char *)lastrm->next_in;
    strm_00->avail_in = (uint)lastrm->avail_in;
    strm_00->total_in_lo32 = (uint)lastrm->total_in;
    strm_00->total_in_hi32 = (uint)(lastrm->total_in >> 0x20);
    strm_00->next_out = (char *)lastrm->next_out;
    strm_00->avail_out = (uint)lastrm->avail_out;
    strm_00->total_out_lo32 = (uint)lastrm->total_out;
    strm_00->total_out_hi32 = (uint)(lastrm->total_out >> 0x20);
    iVar1 = BZ2_bzCompressInit(strm_00,level,0,0x1e);
    if (iVar1 == 0) {
      lastrm->real_stream = strm_00;
      lastrm->valid = 1;
      lastrm->code = compression_code_bzip2;
      lastrm->end = compression_end_bzip2;
      a_local._4_4_ = 0;
    }
    else {
      free(strm_00);
      lastrm->real_stream = (void *)0x0;
      archive_set_error(a,-1,"Internal error initializing compression library");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_bzip2(struct archive *a,
    struct la_zstream *lastrm, int level)
{
	bz_stream *strm;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for bzip2 stream");
		return (ARCHIVE_FATAL);
	}
	/* bzlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (char *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in_lo32 = (uint32_t)(lastrm->total_in & 0xffffffff);
	strm->total_in_hi32 = (uint32_t)(lastrm->total_in >> 32);
	strm->next_out = (char *)lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out_lo32 = (uint32_t)(lastrm->total_out & 0xffffffff);
	strm->total_out_hi32 = (uint32_t)(lastrm->total_out >> 32);
	if (BZ2_bzCompressInit(strm, level, 0, 30) != BZ_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_bzip2;
	lastrm->end = compression_end_bzip2;
	return (ARCHIVE_OK);
}